

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeBindingDivisorTest::SetDivisor
          (AttributeBindingDivisorTest *this,GLuint divisor)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  Enum<int,_2UL> local_1a8;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x16c8))(this->m_vao,0,divisor);
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 != 0) {
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"VertexArrayBindingDivisor unexpectedl generated ",0x30);
    local_1a8.m_getName = glu::getErrorName;
    local_1a8.m_value = iVar1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1a8,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," error when called with divisor",0x1f);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". ",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
  }
  return iVar1 == 0;
}

Assistant:

bool AttributeBindingDivisorTest::SetDivisor(glw::GLuint divisor)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup. */
	gl.vertexArrayBindingDivisor(m_vao, 0, divisor);

	/* Checking for errors (this is tested function so it fail the test if there is error). */
	if (glw::GLenum error = gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "VertexArrayBindingDivisor unexpectedl generated " << glu::getErrorStr(error)
			<< " error when called with divisor" << divisor << ". " << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}